

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O2

Type * soul::Type::createVector(Type *__return_storage_ptr__,PrimitiveType *element,ArraySize size)

{
  PrimitiveType local_c;
  
  local_c = (PrimitiveType)element->type;
  if (((bool_ < local_c.type) || ((0x39cU >> (local_c.type & 0x1f) & 1) == 0)) &&
     (1 < local_c.type - complex32)) {
    throwInternalCompilerError("element.canBeVectorElementType()","createVector",0xed);
  }
  if (size - 1 < 0x100) {
    createSizedType(__return_storage_ptr__,&local_c,vector,size);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("isLegalVectorSize ((int64_t) size)","createVector",0xee);
}

Assistant:

Type Type::createVector (PrimitiveType element, ArraySize size)
{
    SOUL_ASSERT (element.canBeVectorElementType());
    SOUL_ASSERT (isLegalVectorSize ((int64_t) size));
    return createSizedType (element, Category::vector, size);
}